

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

uint nullcGetFunctionType(uint funcID)

{
  if (NULLCTypeInfo::linker == 0) {
    __assert_fail("NULLCTypeInfo::linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x1e1,"unsigned int nullcGetFunctionType(unsigned int)");
  }
  if (funcID < *(uint *)(NULLCTypeInfo::linker + 0x24c)) {
    return *(uint *)(*(long *)(NULLCTypeInfo::linker + 0x240) + 0x40 + (ulong)funcID * 0x94);
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,
                "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

unsigned int	nullcGetFunctionType(unsigned int funcID)
{
	assert(NULLCTypeInfo::linker);
	return NULLCTypeInfo::linker->exFunctions[funcID].funcType;
}